

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O0

void free_mmdb_struct(MMDB_s *mmdb)

{
  MMDB_s *mmdb_local;
  
  if (mmdb != (MMDB_s *)0x0) {
    if (mmdb->filename != (char *)0x0) {
      free(mmdb->filename);
      mmdb->filename = (char *)0x0;
    }
    if (mmdb->file_content != (uint8_t *)0x0) {
      munmap(mmdb->file_content,mmdb->file_size);
    }
    if ((mmdb->metadata).database_type != (char *)0x0) {
      free((mmdb->metadata).database_type);
      (mmdb->metadata).database_type = (char *)0x0;
    }
    free_languages_metadata(mmdb);
    free_descriptions_metadata(mmdb);
  }
  return;
}

Assistant:

static void free_mmdb_struct(MMDB_s *const mmdb) {
    if (!mmdb) {
        return;
    }

    if (NULL != mmdb->filename) {
#if defined(__clang__)
// This is a const char * that we need to free, which isn't valid. However it
// would mean changing the public API to fix this.
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wcast-qual"
#endif
        FREE_AND_SET_NULL(mmdb->filename);
#if defined(__clang__)
#pragma clang diagnostic pop
#endif
    }
    if (NULL != mmdb->file_content) {
#ifdef _WIN32
        UnmapViewOfFile(mmdb->file_content);
        /* Winsock is only initialized if open was successful so we only have
         * to cleanup then. */
        WSACleanup();
#else
#if defined(__clang__)
// This is a const char * that we need to free, which isn't valid. However it
// would mean changing the public API to fix this.
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wcast-qual"
#endif
        munmap((void *)mmdb->file_content, (size_t)mmdb->file_size);
#if defined(__clang__)
#pragma clang diagnostic pop
#endif
#endif
    }

    if (NULL != mmdb->metadata.database_type) {
#if defined(__clang__)
// This is a const char * that we need to free, which isn't valid. However it
// would mean changing the public API to fix this.
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wcast-qual"
#endif
        FREE_AND_SET_NULL(mmdb->metadata.database_type);
#if defined(__clang__)
#pragma clang diagnostic pop
#endif
    }

    free_languages_metadata(mmdb);
    free_descriptions_metadata(mmdb);
}